

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition_search.c
# Opt level: O1

void log_sub_block_var(AV1_COMP *cpi,MACROBLOCK *x,BLOCK_SIZE bs,double *var_min,double *var_max)

{
  aom_variance_fn_t vf;
  int iVar1;
  ulong uVar2;
  uint uVar3;
  int iVar4;
  undefined7 in_register_00000011;
  long lVar5;
  long lVar6;
  int iVar7;
  double dVar8;
  double dVar9;
  double local_58;
  
  iVar4 = (x->e_mbd).mb_to_bottom_edge;
  uVar3 = iVar4 >> 0x1f & (uint)-iVar4 >> 3;
  uVar2 = CONCAT71(in_register_00000011,bs) & 0xffffffff;
  iVar4 = (uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"[uVar2]
          * 4 - uVar3;
  if (iVar4 == 0 ||
      (uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"[uVar2] * 4
      < uVar3) {
    dVar8 = 134217727.9375;
    local_58 = 0.0;
  }
  else {
    uVar3 = ((x->e_mbd).cur_buf)->flags;
    vf = cpi->ppi->fn_ptr[0].vf;
    iVar7 = (x->e_mbd).mb_to_right_edge;
    lVar5 = (ulong)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                   [uVar2] * 4 - (ulong)(iVar7 >> 0x1f & (uint)-iVar7 >> 3);
    local_58 = 0.0;
    iVar7 = 0;
    dVar8 = 2147483647.0;
    do {
      if (0 < (int)lVar5) {
        lVar6 = 0;
        do {
          iVar1 = x->plane[0].src.stride;
          iVar1 = av1_calc_normalized_variance
                            (vf,x->plane[0].src.buf + lVar6 + iVar7 * iVar1,iVar1,uVar3 >> 3 & 1);
          dVar9 = (double)iVar1;
          if (dVar9 <= dVar8) {
            dVar8 = dVar9;
          }
          if (local_58 <= dVar9) {
            local_58 = dVar9;
          }
          lVar6 = lVar6 + 4;
        } while (lVar6 < lVar5);
      }
      iVar7 = iVar7 + 4;
    } while (iVar7 < iVar4);
    dVar8 = dVar8 * 0.0625;
    local_58 = local_58 * 0.0625;
  }
  dVar8 = log1p(dVar8);
  *var_min = dVar8;
  dVar8 = log1p(local_58);
  *var_max = dVar8;
  return;
}

Assistant:

static void log_sub_block_var(const AV1_COMP *cpi, MACROBLOCK *x, BLOCK_SIZE bs,
                              double *var_min, double *var_max) {
  // This functions returns a the minimum and maximum log variances for 4x4
  // sub blocks in the current block.

  const MACROBLOCKD *const xd = &x->e_mbd;
  const int is_hbd = is_cur_buf_hbd(xd);
  const int right_overflow =
      (xd->mb_to_right_edge < 0) ? ((-xd->mb_to_right_edge) >> 3) : 0;
  const int bottom_overflow =
      (xd->mb_to_bottom_edge < 0) ? ((-xd->mb_to_bottom_edge) >> 3) : 0;
  const int bw = MI_SIZE * mi_size_wide[bs] - right_overflow;
  const int bh = MI_SIZE * mi_size_high[bs] - bottom_overflow;

  // Initialize minimum variance to a large value and maximum variance to 0.
  double min_var_4x4 = (double)INT_MAX;
  double max_var_4x4 = 0.0;

  aom_variance_fn_t vf = cpi->ppi->fn_ptr[BLOCK_4X4].vf;
  for (int i = 0; i < bh; i += MI_SIZE) {
    for (int j = 0; j < bw; j += MI_SIZE) {
      int var;
      // Calculate the 4x4 sub-block variance.
      var = av1_calc_normalized_variance(
          vf, x->plane[0].src.buf + (i * x->plane[0].src.stride) + j,
          x->plane[0].src.stride, is_hbd);

      // Record min and max for over-arching block
      min_var_4x4 = AOMMIN(min_var_4x4, var);
      max_var_4x4 = AOMMAX(max_var_4x4, var);
    }
  }
  *var_min = log1p(min_var_4x4 / 16.0);
  *var_max = log1p(max_var_4x4 / 16.0);
}